

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall
GlobOpt::KillLiveElems
          (GlobOpt *this,IndirOpnd *indirOpnd,Opnd *valueOpnd,
          BVSparse<Memory::JitArenaAllocator> *bv,bool inGlobOpt,Func *func)

{
  BasicBlock *pBVar1;
  bool bVar2;
  int32 iVar3;
  Sym *sym;
  JitArenaAllocator *pJVar4;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  ValueInfo *local_e0;
  ValueInfo *local_d8;
  ValueInfo *local_d0;
  ValueInfo *local_c0;
  TrackAllocData local_a0;
  ValueInfo *local_78;
  ValueInfo *baseValueInfo;
  Value *baseValue;
  RegOpnd *baseOpnd;
  ValueInfo *pVStack_58;
  int indexLowerBound;
  ValueInfo *indexValueInfo;
  Value *indexValue;
  RegOpnd *pRStack_40;
  bool isSafeToTransfer;
  RegOpnd *indexOpnd;
  Func *func_local;
  BVSparse<Memory::JitArenaAllocator> *pBStack_28;
  bool inGlobOpt_local;
  BVSparse<Memory::JitArenaAllocator> *bv_local;
  Opnd *valueOpnd_local;
  IndirOpnd *indirOpnd_local;
  GlobOpt *this_local;
  
  indexOpnd = (RegOpnd *)func;
  func_local._7_1_ = inGlobOpt;
  pBStack_28 = bv;
  bv_local = (BVSparse<Memory::JitArenaAllocator> *)valueOpnd;
  valueOpnd_local = &indirOpnd->super_Opnd;
  indirOpnd_local = (IndirOpnd *)this;
  pRStack_40 = IR::IndirOpnd::GetIndexOpnd(indirOpnd);
  indexValue._7_1_ = 1;
  bVar2 = Func::GetThisOrParentInlinerHasArguments((Func *)indexOpnd);
  if ((bVar2) ||
     (bVar2 = IsNonNumericRegOpnd(this,pRStack_40,(bool)(func_local._7_1_ & 1),
                                  (bool *)((long)&indexValue + 7)), bVar2)) {
    KillAllFields(this,pBStack_28);
    SetAnyPropertyMayBeWrittenTo(this);
  }
  else if ((func_local._7_1_ & 1) != 0) {
    if (pRStack_40 == (RegOpnd *)0x0) {
      local_c0 = (ValueInfo *)0x0;
    }
    else {
      pBVar1 = this->currentBlock;
      sym = IR::Opnd::GetSym(&pRStack_40->super_Opnd);
      local_c0 = (ValueInfo *)GlobOptBlockData::FindValue(&pBVar1->globOptData,sym);
    }
    indexValueInfo = local_c0;
    if (local_c0 == (ValueInfo *)0x0) {
      local_d0 = (ValueInfo *)0x0;
    }
    else {
      local_d0 = ::Value::GetValueInfo((Value *)local_c0);
    }
    pVStack_58 = local_d0;
    baseOpnd._4_4_ = 0;
    if ((((indexValue._7_1_ & 1) == 0) ||
        (iVar3 = IR::IndirOpnd::GetOffset((IndirOpnd *)valueOpnd_local), iVar3 < 0)) ||
       ((pRStack_40 != (RegOpnd *)0x0 &&
        (((pVStack_58 == (ValueInfo *)0x0 ||
          (bVar2 = ValueInfo::TryGetIntConstantLowerBound
                             (pVStack_58,(int32 *)((long)&baseOpnd + 4),false), !bVar2)) ||
         (baseOpnd._4_4_ < 0)))))) {
      KillAllObjectTypes(this,pBStack_28);
    }
    else if (((bv_local == (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
             (bVar2 = IR::Opnd::IsVar((Opnd *)bv_local), bVar2)) &&
            (this->objectTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
      baseValue = (Value *)IR::IndirOpnd::GetBaseOpnd((IndirOpnd *)valueOpnd_local);
      if ((RegOpnd *)baseValue == (RegOpnd *)0x0) {
        local_d8 = (ValueInfo *)0x0;
      }
      else {
        local_d8 = (ValueInfo *)
                   GlobOptBlockData::FindValue
                             (&this->currentBlock->globOptData,
                              &((RegOpnd *)baseValue)->m_sym->super_Sym);
      }
      baseValueInfo = local_d8;
      if (local_d8 == (ValueInfo *)0x0) {
        local_e0 = (ValueInfo *)0x0;
      }
      else {
        local_e0 = ::Value::GetValueInfo((Value *)local_d8);
      }
      local_78 = local_e0;
      if (((local_e0 == (ValueInfo *)0x0) ||
          (bVar2 = ValueType::IsNotNativeArray(&local_e0->super_ValueType), !bVar2)) ||
         ((bVar2 = IsLoopPrePass(this), bVar2 &&
          (bVar2 = IsSafeToTransferInPrepass(this,*(StackSym **)(baseValue + 1),local_78), !bVar2)))
         ) {
        if ((this->currentBlock->globOptData).maybeWrittenTypeSyms ==
            (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          pJVar4 = this->alloc;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_a0,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                     ,0x101);
          pJVar4 = (JitArenaAllocator *)
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   *)pJVar4,&local_a0);
          this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                    new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
          BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,this->alloc);
          (this->currentBlock->globOptData).maybeWrittenTypeSyms = this_00;
        }
        BVSparse<Memory::JitArenaAllocator>::Or
                  ((this->currentBlock->globOptData).maybeWrittenTypeSyms,this->objectTypeSyms);
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::KillLiveElems(IR::IndirOpnd * indirOpnd, IR::Opnd * valueOpnd, BVSparse<JitArenaAllocator> * bv, bool inGlobOpt, Func *func)
{
    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    // obj.x = 10;
    // obj["x"] = ...;   // This needs to kill obj.x...  We need to kill all fields...
    //
    // Also, 'arguments[i] =' needs to kill all slots even if 'i' is an int.
    //
    // NOTE: we only need to kill slots here, not all fields. It may be good to separate these one day.
    //
    // Regarding the check for type specialization:
    // - Type specialization does not always update the value to a definite type.
    // - The loop prepass is conservative on values even when type specialization occurs.
    // - We check the type specialization status for the sym as well. For the purpose of doing kills, we can assume that
    //   if type specialization happened, that fields don't need to be killed. Note that they may be killed in the next
    //   pass based on the value.
    bool isSafeToTransfer = true;
    if (func->GetThisOrParentInlinerHasArguments() || this->IsNonNumericRegOpnd(indexOpnd, inGlobOpt, &isSafeToTransfer))
    {
        this->KillAllFields(bv); // This also kills all property type values, as the same bit-vector tracks those stack syms
        SetAnyPropertyMayBeWrittenTo();
    }
    else if (inGlobOpt)
    {
        Value * indexValue = indexOpnd ? this->currentBlock->globOptData.FindValue(indexOpnd->GetSym()) : nullptr;
        ValueInfo * indexValueInfo = indexValue ? indexValue->GetValueInfo() : nullptr;
        int indexLowerBound = 0;

        if (!isSafeToTransfer || indirOpnd->GetOffset() < 0 || (indexOpnd && (!indexValueInfo || !indexValueInfo->TryGetIntConstantLowerBound(&indexLowerBound, false) || indexLowerBound < 0)))
        {
            // Write/delete to a non-integer numeric index can't alias a name on the RHS of a dot, but it change object layout
            this->KillAllObjectTypes(bv);
        }
        else if ((!valueOpnd || valueOpnd->IsVar()) && this->objectTypeSyms != nullptr)
        {
            // If we wind up converting a native array, block final-type opt at this point, because we could evolve
            // to a type with the wrong type ID. Do this by noting that we may have evolved any type and so must
            // check it before evolving it further.
            IR::RegOpnd *baseOpnd = indirOpnd->GetBaseOpnd();
            Value * baseValue = baseOpnd ? this->currentBlock->globOptData.FindValue(baseOpnd->m_sym) : nullptr;
            ValueInfo * baseValueInfo = baseValue ? baseValue->GetValueInfo() : nullptr;
            if (!baseValueInfo || !baseValueInfo->IsNotNativeArray() || 
                (this->IsLoopPrePass() && !this->IsSafeToTransferInPrepass(baseOpnd->m_sym, baseValueInfo)))
            {
                if (this->currentBlock->globOptData.maybeWrittenTypeSyms == nullptr)
                {
                    this->currentBlock->globOptData.maybeWrittenTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
                }
                this->currentBlock->globOptData.maybeWrittenTypeSyms->Or(this->objectTypeSyms);
            }
        }
    }
}